

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_tpl.h
# Opt level: O2

uint8_t * chunkmemset_avx2(uint8_t *out,uint8_t *from,uint len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined8 uVar3;
  uint8_t *puVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong __n;
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  chunk_t_conflict chunk_load;
  undefined1 local_40 [32];
  
  uVar6 = (long)out - (long)from;
  uVar7 = -uVar6;
  if (0 < (long)uVar6) {
    uVar7 = uVar6;
  }
  __n = (ulong)len;
  if (((long)uVar6 < 0) && (uVar7 < __n)) {
    memmove(out,from,__n);
    goto LAB_0010fb37;
  }
  if (uVar7 == 1) {
    memset(out,(uint)*from,__n);
    goto LAB_0010fb37;
  }
  if (0x1f < uVar7) {
    puVar4 = chunkcopy_avx2(out,from,len);
    return puVar4;
  }
  if (len < 0x11) {
    if (0xf < uVar7) {
      uVar3 = *(undefined8 *)(from + 8);
      *(undefined8 *)out = *(undefined8 *)from;
      *(undefined8 *)(out + 8) = uVar3;
      for (uVar7 = (ulong)((len - 1 & 0xf) + 1); len != (uint)uVar7; uVar7 = uVar7 + 0x10) {
        uVar3 = *(undefined8 *)(from + uVar7 + 8);
        *(undefined8 *)(out + uVar7) = *(undefined8 *)(from + uVar7);
        *(undefined8 *)(out + uVar7 + 8) = uVar3;
      }
      return out + uVar7;
    }
    if (uVar7 != 6 && (uVar7 & 1) == 0) goto LAB_0010fbe5;
    auVar9 = vpshufb_avx(*(undefined1 (*) [16])from,
                         *(undefined1 (*) [16])("" + perm_idx_lut[(int)uVar7 - 3].idx));
    if (len == 0x10) {
      *(undefined1 (*) [16])out = auVar9;
      out = out + 0x10;
      len = 0;
    }
    local_40 = ZEXT1632(auVar9);
  }
  else {
LAB_0010fbe5:
    uVar6 = uVar7 - 2 >> 1;
    if ((uVar6 | uVar7 << 0x3f) < 8) {
      puVar4 = (uint8_t *)(*(code *)(&DAT_0011a584 + *(int *)(&DAT_0011a584 + uVar6 * 4)))();
      return puVar4;
    }
    uVar5 = (int)uVar7 - 3;
    if (uVar7 < 0x10) {
      auVar2 = vpaddb_avx2(*(undefined1 (*) [32])("" + perm_idx_lut[uVar5].idx),_DAT_0011a980);
      auVar8._16_16_ = *(undefined1 (*) [16])from;
      auVar8._0_16_ = *(undefined1 (*) [16])from;
      local_40 = vpshufb_avx2(auVar8,auVar2);
    }
    else {
      auVar9[8] = 0xf;
      auVar9._0_8_ = 0xf0f0f0f0f0f0f0f;
      auVar9[9] = 0xf;
      auVar9[10] = 0xf;
      auVar9[0xb] = 0xf;
      auVar9[0xc] = 0xf;
      auVar9[0xd] = 0xf;
      auVar9[0xe] = 0xf;
      auVar9[0xf] = 0xf;
      auVar9 = vpcmpgtb_avx(*(undefined1 (*) [16])("" + perm_idx_lut[uVar5].idx),auVar9);
      auVar1 = vpshufb_avx(*(undefined1 (*) [16])from,
                           *(undefined1 (*) [16])("" + perm_idx_lut[uVar5].idx));
      auVar9 = vpblendvb_avx(auVar1,*(undefined1 (*) [16])(from + 0x10),auVar9);
      local_40._0_16_ = ZEXT116(0) * auVar9 + ZEXT116(1) * *(undefined1 (*) [16])from;
      local_40._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar9;
    }
    uVar5 = 0x20 - perm_idx_lut[uVar5].remval;
    for (; 0x3f < len; len = len + uVar5 * -2) {
      *(undefined1 (*) [32])out = local_40;
      *(undefined1 (*) [32])(*(undefined1 (*) [32])out + uVar5) = local_40;
      out = *(undefined1 (*) [32])out + uVar5 * 2;
    }
    for (; 0x1f < len; len = len - uVar5) {
      *(undefined1 (*) [32])out = local_40;
      out = *(undefined1 (*) [32])out + uVar5;
    }
  }
  if (len == 0) {
    return (uint8_t *)(undefined1 (*) [32])out;
  }
  __n = (ulong)len;
  memcpy(out,local_40,__n);
LAB_0010fb37:
  return *(undefined1 (*) [32])out + __n;
}

Assistant:

static inline uint8_t* CHUNKMEMSET(uint8_t *out, uint8_t *from, unsigned len) {
    /* Debug performance related issues when len < sizeof(uint64_t):
       Assert(len >= sizeof(uint64_t), "chunkmemset should be called on larger chunks"); */
    Assert(from != out, "chunkmemset cannot have a distance 0");

    chunk_t chunk_load;
    uint32_t chunk_mod = 0;
    uint32_t adv_amount;
    int64_t sdist = out - from;
    uint64_t dist = llabs(sdist);

    /* We are supporting the case for when we are reading bytes from ahead in the buffer.
     * We now have to handle this, though it wasn't _quite_ clear if this rare circumstance
     * always needed to be handled here or if we're just now seeing it because we are
     * dispatching to this function, more */
    if (sdist < 0 && dist < len) {
#ifdef HAVE_MASKED_READWRITE
        /* We can still handle this case if we can mitigate over writing _and_ we
         * fit the entirety of the copy length with one load */
        if (len <= sizeof(chunk_t)) {
            /* Tempting to add a goto to the block below but hopefully most compilers
             * collapse these identical code segments as one label to jump to */
            return CHUNKCOPY(out, from, len);
        }
#endif
        /* Here the memmove semantics match perfectly, as when this happens we are
         * effectively sliding down the contents of memory by dist bytes */
        memmove(out, from, len);
        return out + len;
    }

    if (dist == 1) {
        memset(out, *from, len);
        return out + len;
    } else if (dist >= sizeof(chunk_t)) {
        return CHUNKCOPY(out, from, len);
    }

    /* Only AVX2+ as there's 128 bit vectors and 256 bit. We allow for shorter vector
     * lengths because they serve to allow more cases to fall into chunkcopy, as the
     * distance of the shorter length is still deemed a safe distance. We rewrite this
     * here rather than calling the ssse3 variant directly now because doing so required
     * dispatching to another function and broke inlining for this function entirely. We
     * also can merge an assert and some remainder peeling behavior into the same code blocks,
     * making the code a little smaller.  */
#ifdef HAVE_HALF_CHUNK
    if (len <= sizeof(halfchunk_t)) {
        if (dist >= sizeof(halfchunk_t))
            return HALFCHUNKCOPY(out, from, len);

        if ((dist % 2) != 0 || dist == 6) {
            halfchunk_t halfchunk_load = GET_HALFCHUNK_MAG(from, &chunk_mod, (unsigned)dist);

            if (len == sizeof(halfchunk_t)) {
                storehalfchunk(out, &halfchunk_load);
                len -= sizeof(halfchunk_t);
                out += sizeof(halfchunk_t);
            }

            chunk_load = halfchunk2whole(&halfchunk_load);
            goto rem_bytes;
        }
    }
#endif

#ifdef HAVE_CHUNKMEMSET_2
    if (dist == 2) {
        chunkmemset_2(from, &chunk_load);
    } else
#endif
#ifdef HAVE_CHUNKMEMSET_4
    if (dist == 4) {
        chunkmemset_4(from, &chunk_load);
    } else
#endif
#ifdef HAVE_CHUNKMEMSET_8
    if (dist == 8) {
        chunkmemset_8(from, &chunk_load);
    } else
#endif
#ifdef HAVE_CHUNKMEMSET_16
    if (dist == 16) {
        chunkmemset_16(from, &chunk_load);
    } else
#endif
    chunk_load = GET_CHUNK_MAG(from, &chunk_mod, (unsigned)dist);

    adv_amount = sizeof(chunk_t) - chunk_mod;

    while (len >= (2 * sizeof(chunk_t))) {
        storechunk(out, &chunk_load);
        storechunk(out + adv_amount, &chunk_load);
        out += 2 * adv_amount;
        len -= 2 * adv_amount;
    }

    /* If we don't have a "dist" length that divides evenly into a vector
     * register, we can write the whole vector register but we need only
     * advance by the amount of the whole string that fits in our chunk_t.
     * If we do divide evenly into the vector length, adv_amount = chunk_t size*/
    while (len >= sizeof(chunk_t)) {
        storechunk(out, &chunk_load);
        len -= adv_amount;
        out += adv_amount;
    }

#ifdef HAVE_HALF_CHUNK
rem_bytes:
#endif
    if (len) {
        memcpy(out, &chunk_load, len);
        out += len;
    }

    return out;
}